

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
booster::locale::basic_format<char>::basic_format(basic_format<char> *this,message_type *trans)

{
  formattible<char> *this_00;
  long in_RDI;
  basic_message<char> *in_stack_ffffffffffffffd8;
  basic_message<char> *in_stack_ffffffffffffffe0;
  
  basic_message<char>::basic_message(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::__cxx11::string::string((string *)(in_RDI + 0x80));
  *(undefined1 *)(in_RDI + 0xa0) = 1;
  this_00 = (formattible<char> *)(in_RDI + 0xa8);
  do {
    details::formattible<char>::formattible(this_00);
    this_00 = this_00 + 1;
  } while (this_00 != (formattible<char> *)(in_RDI + 0x128));
  *(undefined4 *)(in_RDI + 0x128) = 0;
  std::
  vector<booster::locale::details::formattible<char>,_std::allocator<booster::locale::details::formattible<char>_>_>
  ::vector((vector<booster::locale::details::formattible<char>,_std::allocator<booster::locale::details::formattible<char>_>_>
            *)0x112bc0);
  return;
}

Assistant:

basic_format(message_type const &trans) : 
                message_(trans),
                translate_(true),
                parameters_count_(0)
            {
            }